

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1ToCFFEmbeddedFontWriter.cpp
# Opt level: O0

unsigned_short __thiscall
Type1ToCFFEmbeddedFontWriter::AddStringToStringsArray
          (Type1ToCFFEmbeddedFontWriter *this,string *inString)

{
  bool bVar1;
  size_type sVar2;
  pointer ppVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_bool>
  pVar4;
  unsigned_short local_72;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
  local_70;
  _Base_ptr local_48;
  undefined1 local_40;
  _Self local_38;
  _Self local_30;
  iterator it;
  BoolAndUShort findResult;
  string *inString_local;
  Type1ToCFFEmbeddedFontWriter *this_local;
  
  it._M_node._4_4_ = FindStandardString(this,inString);
  if (((uint)it._M_node._4_4_ & 1) == 0) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
         ::find(&this->mNonStandardStringToIndex,inString);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
         ::end(&this->mNonStandardStringToIndex);
    bVar1 = std::operator==(&local_30,&local_38);
    if (bVar1) {
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->mStrings);
      local_72 = (unsigned_short)sVar2;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
      ::pair<unsigned_short,_true>(&local_70,inString,&local_72);
      pVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
              ::insert(&this->mNonStandardStringToIndex,&local_70);
      local_48 = (_Base_ptr)pVar4.first._M_node;
      local_40 = pVar4.second;
      local_30._M_node = local_48;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
      ::~pair(&local_70);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->mStrings,inString);
    }
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>
             ::operator->(&local_30);
    this_local._6_2_ = ppVar3->second + 0x187;
  }
  else {
    this_local._6_2_ = it._M_node._6_2_;
  }
  return this_local._6_2_;
}

Assistant:

unsigned short Type1ToCFFEmbeddedFontWriter::AddStringToStringsArray(const std::string& inString)
{
	// first - see if this string exists in the standard strings array
	BoolAndUShort findResult = FindStandardString(inString);	

	if(findResult.first)
	{
		// it is - return the index in the standard strings array
		return findResult.second;
	}

	// it's not - add to strings vector and return the index
	StringToUShortMap::iterator it = mNonStandardStringToIndex.find(inString);
	if(it == mNonStandardStringToIndex.end())
	{
		it = mNonStandardStringToIndex.insert(StringToUShortMap::value_type(inString,(unsigned short)mStrings.size())).first;
		mStrings.push_back(inString);
	}
	return it->second + N_STD_STRINGS;
}